

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# defines.cpp
# Opt level: O2

void __thiscall
vera::HaveDefines::addDefine(HaveDefines *this,string *_define,float *_value,int _nValues)

{
  switch(_nValues) {
  case 1:
    (*this->_vptr_HaveDefines[3])((ulong)(uint)*_value);
    return;
  case 2:
    (*this->_vptr_HaveDefines[5])(*(undefined8 *)_value);
    return;
  case 3:
    (*this->_vptr_HaveDefines[6])(*(undefined8 *)_value,(ulong)(uint)_value[2]);
    return;
  case 4:
    (*this->_vptr_HaveDefines[7])(*(undefined8 *)_value,*(undefined8 *)(_value + 2));
    return;
  default:
    return;
  }
}

Assistant:

void HaveDefines::addDefine( const std::string& _define, float* _value, int _nValues) {
    if (_nValues == 1) {
        addDefine(_define, _value[0]);
    }
    else if (_nValues == 2) {
        addDefine(_define, glm::vec2(_value[0], _value[1]));
    }
    else if (_nValues == 3) {
        addDefine(_define, glm::vec3(_value[0], _value[1], _value[2]));
    }
    else if (_nValues == 4) {
        addDefine(_define, glm::vec4(_value[0], _value[1], _value[2], _value[3]));
    }
}